

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::_::
CopyConstructArray_<capnp::compiler::BrandedDecl,_capnp::compiler::BrandedDecl_*,_false,_false>::
ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  BrandedDecl *pBVar1;
  ExceptionGuard *this_local;
  
  while (this->start < this->pos) {
    pBVar1 = this->pos;
    this->pos = pBVar1 + -1;
    dtor<capnp::compiler::BrandedDecl>(pBVar1 + -1);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }